

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_tidy.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  char *pcVar3;
  char cVar4;
  size_t sStack_40;
  
  lVar2 = 1;
  do {
    if (argc <= lVar2) {
LAB_001012b9:
      fwrite("1 warning generated.\n",0x15,1,_stderr);
      return 0;
    }
    pcVar3 = argv[lVar2];
    cVar4 = *pcVar3;
    if (((cVar4 == '-') && (pcVar3[1] == 'p')) && (pcVar3[2] == '\0')) break;
    iVar1 = strcmp(pcVar3,"-bad");
    if (iVar1 == 0) {
      sStack_40 = 0x28;
      fwrite("stdout from bad command line arg \'-bad\'\n",0x28,1,_stdout);
      pcVar3 = "stderr from bad command line arg \'-bad\'\n";
      goto LAB_00101297;
    }
    iVar1 = strncmp(pcVar3,"--export-fixes=",0xf);
    if (iVar1 == 0) {
      __stream = fopen(pcVar3 + 0xf,"w");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"Error opening %s for writing\n",argv[lVar2] + 0xf);
        return 1;
      }
      fclose(__stream);
      pcVar3 = argv[lVar2];
      cVar4 = *pcVar3;
    }
    if (cVar4 != '-') {
      fprintf(_stdout,"%s:0:0: warning: message [checker]\n",pcVar3);
      goto LAB_001012b9;
    }
    lVar2 = lVar2 + 1;
  } while( true );
  do {
    lVar2 = lVar2 + 1;
    if (argc <= (int)lVar2) {
      return 0;
    }
    pcVar3 = argv[lVar2];
  } while (((*pcVar3 != '-') || (pcVar3[1] != '-')) || (pcVar3[2] != '\0'));
  pcVar3 = "Command line arguments unexpectedly appended\n";
  sStack_40 = 0x2d;
LAB_00101297:
  fwrite(pcVar3,sStack_40,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  FILE* f;
  int i;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "-p") == 0) {
      // Ensure compile commands were not appended after the source file
      for (++i; i < argc; ++i) {
        if (strcmp(argv[i], "--") == 0) {
          fprintf(stderr, "Command line arguments unexpectedly appended\n");
          return 1;
        }
      }
      return 0;
    }
    if (strcmp(argv[i], "-bad") == 0) {
      fprintf(stdout, "stdout from bad command line arg '-bad'\n");
      fprintf(stderr, "stderr from bad command line arg '-bad'\n");
      return 1;
    }
    if (strncmp(argv[i], "--export-fixes=", 15) == 0) {
      f = fopen(argv[i] + 15, "w");
      if (!f) {
        fprintf(stderr, "Error opening %s for writing\n", argv[i] + 15);
        return 1;
      }
      fclose(f);
    }
    if (argv[i][0] != '-') {
      fprintf(stdout, "%s:0:0: warning: message [checker]\n", argv[i]);
      break;
    }
  }
  fprintf(stderr, "1 warning generated.\n");
  return 0;
}